

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Maybe<capnp::DynamicValue::Reader> * __thiscall
capnp::compiler::NodeTranslator::readConstant
          (Maybe<capnp::DynamicValue::Reader> *__return_storage_ptr__,NodeTranslator *this,
          Reader source,bool isBootstrap)

{
  BrandedDecl *pBVar1;
  Resolver *pRVar2;
  ErrorReporter *pEVar3;
  PointerReader reader;
  PointerReader reader_00;
  Builder target;
  Field field;
  ImplicitParams implicitMethodParams;
  undefined1 auVar4 [40];
  Reader name;
  Reader name_00;
  undefined1 auVar5 [16];
  Type TVar6;
  CapTableReader *pCVar7;
  byte bVar8;
  StructSchema schema;
  char *pcVar9;
  undefined8 uVar10;
  uint uVar11;
  _func_int **pp_Var12;
  undefined7 in_register_00000011;
  SegmentReader *pSVar13;
  word *pwVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  char (*in_R8) [32];
  ulong uVar18;
  ulong uVar19;
  BrandScope *pBVar20;
  ulong uVar21;
  bool bVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  ListSchema schema_00;
  Reader RVar28;
  DebugExpression<bool> _kjCondition;
  Reader proto;
  Type constType;
  Builder bindings;
  Schema constSchema;
  Reader constValue;
  Reader objValue;
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamicConst;
  MallocMessageBuilder builder;
  Builder constBrand;
  BrandedDecl constDecl;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  StructDataBitCount SVar32;
  Fault local_508;
  undefined8 uVar33;
  undefined2 uVar34;
  undefined2 uVar35;
  undefined4 uVar36;
  undefined2 uVar37;
  undefined2 uVar38;
  undefined4 uVar39;
  undefined2 uVar40;
  undefined1 uVar41;
  undefined1 in_stack_fffffffffffffb27;
  undefined4 uVar42;
  undefined4 in_stack_fffffffffffffb2c;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4b8 [16];
  SegmentReader *local_4a8;
  WirePointer *pWStack_4a0;
  uint local_498;
  ushort uStack_494;
  undefined2 uStack_492;
  int iStack_490;
  Type local_488;
  WirePointer *local_478;
  Maybe<capnp::DynamicValue::Reader> *local_468;
  undefined4 local_45c;
  undefined1 local_458 [8];
  anon_union_8_2_eba6ea51_for_Type_5 aStack_450;
  undefined7 uStack_448;
  undefined1 uStack_441;
  uint uStack_440;
  BitsPerElementN<23> BStack_43c;
  uint uStack_438;
  StructPointerCount SStack_434;
  ElementSize EStack_432;
  undefined1 local_431;
  StructDataBitCount SStack_430;
  BitsPerElementN<23> BStack_42c;
  undefined7 uStack_428;
  undefined1 uStack_421;
  undefined7 uStack_420;
  undefined1 uStack_419;
  undefined7 uStack_418;
  Schema local_410;
  char *local_408;
  long local_400;
  Maybe<capnp::compiler::BrandedDecl> local_3f8;
  undefined1 local_348 [12];
  undefined4 uStack_33c;
  WirePointer *local_338;
  StructDataBitCount SStack_330;
  undefined4 uStack_32c;
  undefined8 local_328;
  ulong local_300;
  ulong local_2f8;
  BrandScope *local_2f0;
  ArrayPtr<const_char> local_2e8;
  undefined1 local_2d8 [64];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  ArrayDisposer *local_258;
  undefined8 *puStack_250;
  undefined8 *local_248;
  void *pvStack_240;
  void *local_238;
  char local_230;
  void *local_228;
  void *pvStack_220;
  void *local_218;
  void *pvStack_210;
  void *local_208;
  void *pvStack_200;
  Disposer *local_1f8;
  BrandScope *pBStack_1f0;
  SegmentReader *local_1e8;
  CapTableReader *pCStack_1e0;
  void *local_1d8;
  WirePointer *pWStack_1d0;
  void *local_1c8;
  void *pvStack_1c0;
  undefined8 local_178;
  WirePointer *pWStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  StructBuilder local_138;
  BrandedDecl local_108;
  ulong uVar22;
  
  local_45c = (undefined4)CONCAT71(in_register_00000011,isBootstrap);
  local_108.body.tag = 0;
  local_108.brand.disposer = (Disposer *)0x0;
  local_108.brand.ptr = (BrandScope *)0x0;
  local_108.source._reader.segment = (SegmentReader *)0x0;
  local_108.source._reader.capTable = (CapTableReader *)0x0;
  local_108.source._reader.data = (void *)0x0;
  local_108.source._reader.pointers._0_6_ = 0;
  local_108.source._reader.pointers._6_2_ = 0;
  local_108.source._reader.dataSize = 0;
  local_108.source._reader.pointerCount = 0;
  local_108.source._reader.nestingLimit = 0x7fffffff;
  uVar36 = 0;
  uVar37 = 0;
  uVar38 = 0;
  uVar39 = 0;
  uVar40 = 0;
  uVar33 = (WirePointer *)0x0;
  uVar25 = 0;
  uVar34 = 0;
  uVar35 = 0;
  local_508.exception = (Exception *)0x0;
  uVar24 = 0;
  uVar26 = 0;
  uVar41 = INLINE_COMPOSITE;
  uVar42 = 0x7fffffff;
  implicitMethodParams.params.reader._44_4_ = in_stack_fffffffffffffb2c;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = in_stack_fffffffffffffb27;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  uVar29 = source._reader.data._0_4_;
  uVar30 = source._reader.data._4_4_;
  uVar31 = source._reader.pointers._0_4_;
  auVar4 = ZEXT2440(ZEXT824(0) << 0x40);
  implicitMethodParams.scopeId = auVar4._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar4._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar4._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar4._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar4._32_4_;
  implicitMethodParams.params.reader.step = auVar4._36_4_;
  BrandScope::compileDeclExpression
            (&local_3f8,(this->localBrand).ptr,source,this->resolver,implicitMethodParams);
  bVar23 = local_3f8.ptr.isSet;
  local_268[0] = local_3f8.ptr.isSet;
  if (local_3f8.ptr.isSet == true) {
    local_268._8_4_ = local_3f8.ptr.field_1.value.body.tag;
    if (local_3f8.ptr.field_1.value.body.tag == 2) {
      local_258 = (ArrayDisposer *)local_3f8.ptr.field_1._8_8_;
      puStack_250 = (undefined8 *)local_3f8.ptr.field_1._16_8_;
    }
    else if (local_3f8.ptr.field_1.value.body.tag == 1) {
      local_238 = (void *)local_3f8.ptr.field_1._40_8_;
      local_248 = (undefined8 *)local_3f8.ptr.field_1._24_8_;
      pvStack_240 = (void *)local_3f8.ptr.field_1._32_8_;
      local_258 = (ArrayDisposer *)local_3f8.ptr.field_1._8_8_;
      puStack_250 = (undefined8 *)local_3f8.ptr.field_1._16_8_;
      local_230 = local_3f8.ptr.field_1._48_1_;
      if (local_3f8.ptr.field_1._48_1_ == '\x01') {
        local_208 = (void *)local_3f8.ptr.field_1._88_8_;
        pvStack_200 = (void *)local_3f8.ptr.field_1._96_8_;
        local_218 = (void *)local_3f8.ptr.field_1._72_8_;
        pvStack_210 = (void *)local_3f8.ptr.field_1._80_8_;
        local_228 = (void *)local_3f8.ptr.field_1._56_8_;
        pvStack_220 = (void *)local_3f8.ptr.field_1._64_8_;
        local_3f8.ptr.field_1._48_1_ = '\0';
      }
    }
    local_1f8 = local_3f8.ptr.field_1.value.brand.disposer;
    pBStack_1f0 = local_3f8.ptr.field_1.value.brand.ptr;
    local_1e8 = local_3f8.ptr.field_1.value.source._reader.segment;
    pCStack_1e0 = local_3f8.ptr.field_1.value.source._reader.capTable;
    local_1d8 = local_3f8.ptr.field_1.value.source._reader.data;
    pWStack_1d0 = local_3f8.ptr.field_1.value.source._reader.pointers;
    local_1c8 = (void *)local_3f8.ptr.field_1._152_8_;
    pvStack_1c0 = (void *)local_3f8.ptr.field_1._160_8_;
    BrandedDecl::operator=(&local_108,(BrandedDecl *)(local_268 + 8));
    bVar8 = local_268[0];
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
    bVar8 = local_3f8.ptr.isSet;
  }
  pBVar20 = pBStack_1f0;
  if ((bVar8 & 1) != 0) {
    if (pBStack_1f0 != (BrandScope *)0x0) {
      pBStack_1f0 = (BrandScope *)0x0;
      (**local_1f8->_vptr_Disposer)
                (local_1f8,
                 (pBVar20->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                 (long)&(pBVar20->super_Refcounted).super_Disposer._vptr_Disposer);
    }
    if (local_268._8_4_ - 1 < 2) {
      local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
    }
  }
  if (bVar23 == false) goto LAB_00168e22;
  BrandedDecl::getKind(&local_108);
  if ((local_268[0] != '\x01') || (local_268._2_2_ != 2)) {
    pEVar3 = this->errorReporter;
    name._reader.segment._4_4_ = uVar26;
    name._reader.segment._0_4_ = uVar24;
    name._reader.capTable = (CapTableReader *)uVar33;
    name._reader.data._0_4_ = uVar25;
    name._reader.data._4_2_ = uVar34;
    name._reader.data._6_2_ = uVar35;
    name._reader.pointers._0_4_ = uVar36;
    name._reader.pointers._4_2_ = uVar37;
    name._reader.pointers._6_2_ = uVar38;
    name._reader.dataSize = uVar39;
    name._reader.pointerCount = uVar40;
    name._reader._38_1_ = uVar41;
    name._reader._39_1_ = in_stack_fffffffffffffb27;
    name._reader.nestingLimit = uVar42;
    name._reader._44_4_ = in_stack_fffffffffffffb2c;
    SVar32 = source._reader.dataSize;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[32]>
              ((String *)local_268,(kj *)0x2143f4,(char (*) [2])&local_3f8,
               (String *)"\' does not refer to a constant.",in_R8);
    pp_Var12 = (_func_int **)local_268._0_8_;
    if ((void *)local_268._8_8_ == (void *)0x0) {
      pp_Var12 = (_func_int **)0x229f1b;
    }
    uVar19 = 0;
    if (source._reader.dataSize < 0x40) {
      uVar21 = 0;
    }
    else {
      uVar21 = (ulong)*(uint *)((long)source._reader.data + 4);
      if (0x9f < source._reader.dataSize) {
        uVar19 = (ulong)*(uint *)((long)source._reader.data + 0x10);
      }
    }
    (**pEVar3->_vptr_ErrorReporter)
              (pEVar3,uVar21,uVar19,pp_Var12,
               local_268._8_8_ + (ulong)((void *)local_268._8_8_ == (void *)0x0));
    uVar10 = local_268._8_8_;
    uVar33 = local_268._0_8_;
    if ((_func_int **)local_268._0_8_ != (_func_int **)0x0) {
      local_268._0_8_ = (_func_int **)0x0;
      local_268._8_8_ = (void *)0x0;
      (**local_258->_vptr_ArrayDisposer)
                (local_258,uVar33,1,uVar10,uVar10,0,source._reader.segment._0_4_,
                 source._reader.capTable._0_4_,uVar29,uVar31,SVar32,source._reader.nestingLimit);
    }
    uVar10 = local_3f8.ptr.field_1._0_8_;
    uVar33 = local_3f8.ptr._0_8_;
    if ((Exception *)local_3f8.ptr._0_8_ != (Exception *)0x0) {
      local_3f8.ptr._0_8_ = (Exception *)0x0;
      local_3f8.ptr.field_1._0_8_ = (undefined8 *)0x0;
      (*(code *)**(undefined8 **)local_3f8.ptr.field_1._8_8_)
                (local_3f8.ptr.field_1._8_8_,uVar33,1,uVar10,uVar10,0);
    }
    (__return_storage_ptr__->ptr).isSet = false;
    goto LAB_00168e22;
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_268,0x100,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_508,(MessageBuilder *)local_268);
  local_3f8.ptr.field_1._0_8_ = CONCAT44(uVar26,uVar24);
  local_3f8.ptr._0_8_ = local_508.exception;
  local_3f8.ptr.field_1._8_8_ = uVar33;
  capnp::_::PointerBuilder::getStruct
            (&local_138,(PointerBuilder *)&local_3f8,(StructSize)0x10000,(word *)0x0);
  local_508.exception._0_1_ = local_108.body.tag == 1;
  local_468 = __return_storage_ptr__;
  if (local_108.body.tag != 1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
               ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
               (DebugExpression<bool> *)&local_508);
    kj::_::Debug::Fault::fatal((Fault *)&local_3f8);
  }
  local_4b8._0_8_ = (SegmentReader *)0x0;
  local_4b8._8_8_ = (SegmentReader *)0x0;
  local_4a8 = (SegmentReader *)0x0;
  pWStack_4a0 = (WirePointer *)&kj::NullArrayDisposer::instance;
  pSVar13 = (SegmentReader *)0x0;
  local_2f0 = local_108.brand.ptr;
  pBVar20 = local_108.brand.ptr;
  do {
    if (((pBVar20->params).size_ != 0) ||
       ((pBVar20->inherited == true && (pBVar20->leafParamCount != 0)))) {
      if (pSVar13 == local_4a8) {
        sVar17 = (long)pSVar13 - local_4b8._0_8_ >> 2;
        if (pSVar13 == (SegmentReader *)local_4b8._0_8_) {
          sVar17 = 4;
        }
        kj::Vector<capnp::compiler::BrandScope_*>::setCapacity
                  ((Vector<capnp::compiler::BrandScope_*> *)local_4b8,sVar17);
        pSVar13 = (SegmentReader *)local_4b8._8_8_;
      }
      pSVar13->arena = (Arena *)pBVar20;
      pSVar13 = (SegmentReader *)(local_4b8._8_8_ + 8);
      local_4b8._8_8_ = pSVar13;
    }
    pBVar20 = (pBVar20->parent).ptr.ptr;
  } while (pBVar20 != (BrandScope *)0x0);
  if ((long)pSVar13 - local_4b8._0_8_ != 0) {
    local_508.exception = (Exception *)local_138.segment;
    uVar31 = SUB84(local_138.capTable,0);
    uVar24 = (undefined4)((ulong)local_138.capTable >> 0x20);
    capnp::_::PointerBuilder::initStructList
              ((ListBuilder *)&local_3f8,(PointerBuilder *)&local_508,
               (ElementCount)((ulong)((long)pSVar13 - local_4b8._0_8_) >> 3),(StructSize)0x10002);
    if (local_4b8._8_8_ - local_4b8._0_8_ != 0) {
      uVar19 = (long)(local_4b8._8_8_ - local_4b8._0_8_) >> 3;
      uVar21 = 0;
      uVar33 = local_138.pointers;
      local_300 = uVar19;
      do {
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&local_508,(ListBuilder *)&local_3f8,(ElementCount)uVar21);
        pBVar20 = (BrandScope *)((Arena **)local_4b8._0_8_)[uVar21 & 0xffffffff];
        *(uint64_t *)&((SegmentReader *)uVar33)->arena = pBVar20->leafId;
        if (pBVar20->inherited == true) {
          *(undefined2 *)&(((SegmentReader *)uVar33)->id).value = 1;
          uVar22 = uVar21;
        }
        else {
          sVar17 = (pBVar20->params).size_;
          *(undefined2 *)&(((SegmentReader *)uVar33)->id).value = 0;
          local_2d8._16_8_ = CONCAT26(uVar35,CONCAT24(uVar34,uVar25));
          local_2d8._12_4_ = uVar24;
          local_2d8._8_4_ = uVar31;
          local_2d8._0_8_ = local_508.exception;
          local_2f8 = uVar21;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_458,(PointerBuilder *)local_2d8,(ElementCount)sVar17,
                     (StructSize)0x10001);
          uVar16 = (ulong)uStack_440;
          uVar19 = local_300;
          uVar22 = local_2f8;
          if (uVar16 != 0) {
            lVar15 = 0;
            uVar18 = 0;
            do {
              pBVar1 = (((BrandScope *)((Arena **)local_4b8._0_8_)[uVar21 & 0xffffffff])->params).
                       ptr;
              pEVar3 = local_2f0->errorReporter;
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_2d8,(ListBuilder *)local_458,(ElementCount)uVar18);
              *(undefined2 *)&((WireValue<uint32_t> *)local_2d8._16_8_)->value = 1;
              local_488.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_2d8._8_8_;
              local_488.baseType = local_2d8._0_2_;
              local_488.listDepth = local_2d8[2];
              local_488.isImplicitParam = (bool)local_2d8[3];
              local_488.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_2d8._4_2_;
              local_488._6_2_ = local_2d8._6_2_;
              local_478 = (WirePointer *)local_2d8._24_8_;
              capnp::_::PointerBuilder::initStruct
                        ((StructBuilder *)local_348,(PointerBuilder *)&local_488,(StructSize)0x10003
                        );
              target._builder.capTable._0_4_ = (int)stack0xfffffffffffffcc0;
              target._builder.segment = (SegmentBuilder *)local_348._0_8_;
              target._builder.capTable._4_4_ = (int)((ulong)stack0xfffffffffffffcc0 >> 0x20);
              target._builder.data._0_4_ = (int)local_338;
              target._builder.data._4_4_ = (int)((ulong)local_338 >> 0x20);
              target._builder.pointers._0_4_ = SStack_330;
              target._builder.pointers._4_4_ = uStack_32c;
              target._builder.dataSize = (StructDataBitCount)local_328;
              target._builder._36_4_ = SUB84(local_328,4);
              BrandedDecl::compileAsType
                        ((BrandedDecl *)((long)&(pBVar1->body).tag + lVar15),pEVar3,target);
              uVar18 = uVar18 + 1;
              lVar15 = lVar15 + 0xa8;
              uVar19 = local_300;
              uVar22 = local_2f8;
            } while (uVar16 != uVar18);
          }
        }
        uVar21 = uVar22 + 1;
      } while (uVar21 != uVar19);
    }
  }
  pSVar13 = local_4a8;
  uVar10 = local_4b8._8_8_;
  uVar33 = local_4b8._0_8_;
  if ((SegmentReader *)local_4b8._0_8_ != (SegmentReader *)0x0) {
    local_4b8._0_8_ = (SegmentReader *)0x0;
    local_4b8._8_8_ = (SegmentReader *)0x0;
    local_4a8 = (SegmentReader *)0x0;
    (**(_func_int **)*pWStack_4a0)
              (pWStack_4a0,uVar33,8,(long)(uVar10 - uVar33) >> 3,(long)pSVar13 - uVar33 >> 3,0);
  }
  local_410.raw = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
  pRVar2 = this->resolver;
  capnp::_::StructBuilder::asReader(&local_138);
  (*pRVar2->_vptr_Resolver[6])(&local_3f8,pRVar2,local_108.body.field_1._0_8_);
  __return_storage_ptr__ = local_468;
  if (local_3f8.ptr.isSet == true) {
    local_410.raw = (RawBrandedSchema *)local_3f8.ptr.field_1._0_8_;
    Schema::getProto((Reader *)local_4b8,&local_410);
    __return_storage_ptr__ = local_468;
    if ((char)local_45c == '\0') {
      (*this->resolver->_vptr_Resolver[7])(&local_3f8,this->resolver,local_108.body.field_1._0_8_);
      if (local_3f8.ptr.isSet != true) goto LAB_001687a3;
      local_4b8._0_8_ = local_3f8.ptr.field_1._0_8_;
      local_4b8._8_8_ = local_3f8.ptr.field_1._8_8_;
      local_4a8 = (SegmentReader *)local_3f8.ptr.field_1._16_8_;
      pWStack_4a0 = (WirePointer *)local_3f8.ptr.field_1._24_8_;
      local_498 = local_3f8.ptr.field_1._32_4_;
      uStack_494 = local_3f8.ptr.field_1._36_2_;
      uStack_492 = local_3f8.ptr.field_1._38_2_;
      _iStack_490 = local_3f8.ptr.field_1._40_8_;
    }
    uVar33 = pWStack_4a0 + 4;
    if (uStack_494 < 5) {
      uVar24._0_1_ = false;
      uVar24._1_3_ = 0;
      local_508.exception._0_4_ = 0;
      local_508.exception._4_4_ = 0;
      uVar26 = 0;
      uVar31 = 0x7fffffff;
      uVar33 = (WirePointer *)0x0;
    }
    else {
      local_508.exception._0_4_ = local_4b8._0_4_;
      local_508.exception._4_4_ = local_4b8._4_4_;
      uVar24 = local_4b8._8_4_;
      uVar26 = local_4b8._12_4_;
      uVar31 = iStack_490;
    }
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_3f8,(PointerReader *)&local_508,(word *)0x0);
    local_2d8._8_8_ = local_3f8.ptr._0_8_;
    local_2d8._16_8_ = local_3f8.ptr.field_1._0_8_;
    local_2d8._24_8_ = local_3f8.ptr.field_1._8_8_;
    local_2d8._32_8_ = local_3f8.ptr.field_1._16_8_;
    local_2d8._40_8_ = local_3f8.ptr.field_1._24_8_;
    local_2d8._48_8_ = local_3f8.ptr.field_1._32_8_;
    local_2d8._0_8_ = (long)schemas::s_ce23dcd2d7b00c9b + 0x48;
    DynamicStruct::Reader::which
              ((Maybe<capnp::StructSchema::Field> *)&local_508,(Reader *)local_2d8);
    if (local_508.exception._0_1_ != true) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_488.field_4.scopeId;
      local_488 = (Type)(auVar5 << 0x40);
      local_508.exception = (Exception *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_488,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_488);
    }
    local_178 = CONCAT44(uVar26,uVar24);
    local_168 = CONCAT26(uVar35,CONCAT24(uVar34,uVar31));
    uStack_160 = CONCAT26(uVar38,CONCAT24(uVar37,uVar36));
    local_158 = CONCAT17(in_stack_fffffffffffffb27,CONCAT16(uVar41,CONCAT24(uVar40,uVar39)));
    uStack_150 = CONCAT44(in_stack_fffffffffffffb2c,uVar42);
    local_458[7] = SUB41(uVar24,0);
    aStack_450.scopeId._0_4_ = (undefined4)((ulong)local_178 >> 8);
    aStack_450.scopeId._7_1_ = (undefined1)uVar33;
    aStack_450._4_3_ = (int3)((uint)uVar26 >> 8);
    uStack_448 = (undefined7)((ulong)uVar33 >> 8);
    uStack_441 = (undefined1)uVar31;
    uStack_440 = (uint)(CONCAT24(uVar34,uVar31) >> 8);
    BStack_43c._0_3_ = (undefined3)((ulong)local_168 >> 0x28);
    BStack_43c._3_1_ = (undefined1)uVar36;
    uStack_438 = (uint)(CONCAT24(uVar37,uVar36) >> 8);
    SStack_434 = (StructPointerCount)((ulong)uStack_160 >> 0x28);
    EStack_432 = (ElementSize)((ushort)uVar38 >> 8);
    local_431 = (undefined1)uVar39;
    SStack_430 = (StructDataBitCount)(CONCAT24(uVar40,uVar39) >> 8);
    BStack_42c._0_3_ = (undefined3)((ulong)local_158 >> 0x28);
    BStack_42c._3_1_ = (undefined1)uVar42;
    uStack_428 = (undefined7)((ulong)uStack_150 >> 8);
    uStack_421 = (undefined1)local_4d0;
    uStack_420 = (undefined7)((ulong)local_4d0 >> 8);
    uStack_419 = (undefined1)uStack_4c8;
    uStack_418 = (undefined7)((ulong)uStack_4c8 >> 8);
    field.parent.super_Schema.raw._4_4_ = uVar26;
    field.parent.super_Schema.raw._0_4_ = uVar24;
    field.index = (int)uVar33;
    field._12_4_ = (int)((ulong)uVar33 >> 0x20);
    field.proto._reader.segment._0_4_ = uVar31;
    field.proto._reader.segment._4_4_ = (int)((ulong)local_168 >> 0x20);
    field.proto._reader.capTable._0_4_ = uVar36;
    field.proto._reader.capTable._4_4_ = (int)((ulong)uStack_160 >> 0x20);
    field.proto._reader.data._0_4_ = uVar39;
    field.proto._reader.data._4_4_ = (int)((ulong)local_158 >> 0x20);
    field.proto._reader.pointers._0_4_ = uVar42;
    field.proto._reader.pointers._4_4_ = in_stack_fffffffffffffb2c;
    field.proto._reader._32_8_ = local_4d0;
    field.proto._reader._40_8_ = uStack_4c8;
    pWStack_170 = (WirePointer *)uVar33;
    DynamicStruct::Reader::get((Reader *)&local_3f8,(Reader *)local_2d8,field);
    if (local_3f8.ptr._0_4_ == ANY_POINTER) {
      DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
                ((ReaderFor<AnyPointer> *)local_348,(Reader *)&local_3f8);
      local_508.exception = (Exception *)Schema::asConst(&local_410);
      local_488 = ConstSchema::getType((ConstSchema *)&local_508);
      uVar11 = 0xe;
      if (((undefined1  [16])local_488 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        uVar11 = local_488._0_4_;
      }
      if ((short)uVar11 == 0xe) {
        schema_00 = Type::asList(&local_488);
        reader_00.capTable._0_4_ = (int)stack0xfffffffffffffcc0;
        reader_00.segment = (SegmentReader *)local_348._0_8_;
        reader_00.capTable._4_4_ = (int)((ulong)stack0xfffffffffffffcc0 >> 0x20);
        reader_00.pointer._0_4_ = (int)local_338;
        reader_00.pointer._4_4_ = (int)((ulong)local_338 >> 0x20);
        reader_00.nestingLimit = SStack_330;
        reader_00._28_4_ = uStack_32c;
        capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                  ((Reader *)local_458,reader_00,schema_00);
        local_508.exception._0_4_ = 8;
        uVar33 = CONCAT44(aStack_450.scopeId._4_4_,aStack_450.scopeId._0_4_);
        uVar31 = (undefined4)uStack_448;
        uVar34 = (undefined2)((uint7)uStack_448 >> 0x20);
        uVar35 = (undefined2)(CONCAT17(uStack_441,uStack_448) >> 0x30);
        uVar37 = (undefined2)BStack_43c;
        uVar38 = (undefined2)(BStack_43c >> 0x10);
        uVar24 = local_458._0_4_;
        uVar26 = local_458._4_4_;
        uVar36 = uStack_440;
        uVar39 = uStack_438;
        uVar40 = SStack_434;
        uVar41 = EStack_432;
        in_stack_fffffffffffffb27 = local_431;
        uVar42 = SStack_430;
        in_stack_fffffffffffffb2c = BStack_42c;
        DynamicValue::Reader::operator=((Reader *)&local_3f8,(Reader *)&local_508);
        DynamicValue::Reader::~Reader((Reader *)&local_508);
      }
      else if ((uVar11 & 0xffff) == 0x10) {
        schema = Type::asStruct(&local_488);
        reader.capTable._0_4_ = (int)stack0xfffffffffffffcc0;
        reader.segment = (SegmentReader *)local_348._0_8_;
        reader.capTable._4_4_ = (int)((ulong)stack0xfffffffffffffcc0 >> 0x20);
        reader.pointer._0_4_ = (int)local_338;
        reader.pointer._4_4_ = (int)((ulong)local_338 >> 0x20);
        reader.nestingLimit = SStack_330;
        reader._28_4_ = uStack_32c;
        capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                  ((Reader *)local_458,reader,schema);
        local_508.exception._0_4_ = 10;
        uVar33 = CONCAT44(aStack_450.scopeId._4_4_,aStack_450.scopeId._0_4_);
        uVar31 = (undefined4)uStack_448;
        uVar34 = (undefined2)((uint7)uStack_448 >> 0x20);
        uVar35 = (undefined2)(CONCAT17(uStack_441,uStack_448) >> 0x30);
        uVar37 = (undefined2)BStack_43c;
        uVar38 = (undefined2)(BStack_43c >> 0x10);
        uVar24 = local_458._0_4_;
        uVar26 = local_458._4_4_;
        uVar36 = uStack_440;
        uVar39 = uStack_438;
        uVar40 = SStack_434;
        uVar41 = EStack_432;
        in_stack_fffffffffffffb27 = local_431;
        uVar42 = SStack_430;
        in_stack_fffffffffffffb2c = BStack_42c;
        DynamicValue::Reader::operator=((Reader *)&local_3f8,(Reader *)&local_508);
        DynamicValue::Reader::~Reader((Reader *)&local_508);
      }
      else if ((uVar11 & 0xffff) != 0x12) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                  (&local_508,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x92f,FAILED,(char *)0x0,
                   "\"Unrecognized AnyPointer-typed member of schema::Value.\"",
                   (char (*) [55])"Unrecognized AnyPointer-typed member of schema::Value.");
        kj::_::Debug::Fault::fatal(&local_508);
      }
    }
    if ((0xf < source._reader.dataSize) && (*source._reader.data == 5)) {
      if (local_498 < 0xc0) {
        pwVar14 = (word *)0x0;
      }
      else {
        pwVar14 = (local_4a8->ptr).ptr;
      }
      local_278 = 0;
      local_288 = 0;
      uStack_280 = 0;
      local_298 = 0;
      uStack_290 = 0;
      uStack_270 = 0x7fffffff;
      (*this->resolver->_vptr_Resolver[6])(&local_508,this->resolver,pwVar14);
      local_488.baseType._0_1_ = local_508.exception._0_1_;
      TVar6 = local_488;
      if (local_508.exception._0_1_ == true) {
        local_488.field_4.scopeId._4_4_ = uVar26;
        local_488.field_4.scopeId._0_4_ = uVar24;
        local_488._0_8_ = TVar6._0_8_;
        Schema::getProto((Reader *)&local_508,(Schema *)&local_488.field_4);
        pcVar9 = "";
        local_408 = "";
        local_400 = 1;
        lVar15 = 1;
        if ((0x6f < (uint)uVar36) &&
           ((((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(uVar33 + 0xc))->structRef).dataSize.
            value != 0)) {
          bVar23 = uVar37 == 0;
          uVar10 = CONCAT26(uVar35,CONCAT24(uVar34,uVar31));
          if (bVar23) {
            uVar10 = 0;
          }
          uStack_440 = 0x7fffffff;
          if (!bVar23) {
            uStack_440 = uVar39;
          }
          aStack_450._0_1_ = false;
          aStack_450._1_3_ = 0;
          local_458._0_4_ = UNKNOWN;
          local_458._4_4_ = 0;
          aStack_450.scopeId._4_4_ = 0;
          if (!bVar23) {
            local_458._0_4_ = (Type)local_508.exception;
            local_458._4_4_ = local_508.exception._4_4_;
            aStack_450.scopeId._0_4_ = uVar24;
            aStack_450.scopeId._4_4_ = uVar26;
          }
          uStack_448 = (undefined7)uVar10;
          uStack_441 = (undefined1)((ulong)uVar10 >> 0x38);
          RVar28 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)local_458,(void *)0x0,0);
          if ((uint)uVar36 < 0x60) {
            uVar19 = 0;
          }
          else {
            uVar19 = (ulong)(((SegmentReader *)uVar33)->id).value;
          }
          pcVar9 = RVar28.super_StringPtr.content.ptr + uVar19;
          lVar15 = RVar28.super_StringPtr.content.size_ - uVar19;
        }
        bVar23 = source._reader.pointerCount == 0;
        local_338 = source._reader.pointers;
        if (bVar23) {
          local_338 = (WirePointer *)0x0;
        }
        SStack_330 = 0x7fffffff;
        if (!bVar23) {
          SStack_330 = source._reader.nestingLimit;
        }
        local_348._0_4_ = 0;
        local_348._4_4_ = 0;
        uVar25 = 0;
        uVar27 = 0;
        if (!bVar23) {
          local_348._0_4_ = source._reader.segment._0_4_;
          local_348._4_4_ = source._reader.segment._4_4_;
          uVar25 = source._reader.capTable._0_4_;
          uVar27 = source._reader.capTable._4_4_;
        }
        stack0xfffffffffffffcc0 = (CapTableReader *)CONCAT44(uVar27,uVar25);
        local_408 = pcVar9;
        local_400 = lVar15;
        capnp::_::PointerReader::getStruct
                  ((StructReader *)local_458,(PointerReader *)local_348,(word *)0x0);
        bVar23 = SStack_434 == 0;
        local_338 = (WirePointer *)CONCAT44(BStack_43c,uStack_440);
        if (bVar23) {
          local_338 = (WirePointer *)0x0;
        }
        SStack_330 = 0x7fffffff;
        if (!bVar23) {
          SStack_330 = SStack_430;
        }
        uVar25._0_1_ = false;
        uVar25._1_3_ = 0;
        local_348._0_4_ = UNKNOWN;
        local_348._4_4_ = 0;
        uVar27 = 0;
        if (!bVar23) {
          local_348._0_4_ = local_458._0_4_;
          local_348._4_4_ = local_458._4_4_;
          uVar25 = aStack_450.scopeId._0_4_;
          uVar27 = aStack_450.scopeId._4_4_;
        }
        stack0xfffffffffffffcc0 = (CapTableReader *)CONCAT44(uVar27,uVar25);
        local_2e8 = (ArrayPtr<const_char>)
                    capnp::_::PointerReader::getBlob<capnp::Text>
                              ((PointerReader *)local_348,(void *)0x0,0);
        pEVar3 = this->errorReporter;
        name_00._reader.segment._4_4_ = uVar26;
        name_00._reader.segment._0_4_ = uVar24;
        name_00._reader.capTable = (CapTableReader *)uVar33;
        name_00._reader.data._0_4_ = uVar31;
        name_00._reader.data._4_2_ = uVar34;
        name_00._reader.data._6_2_ = uVar35;
        name_00._reader.pointers._0_4_ = uVar36;
        name_00._reader.pointers._4_2_ = uVar37;
        name_00._reader.pointers._6_2_ = uVar38;
        name_00._reader.dataSize = uVar39;
        name_00._reader.pointerCount = uVar40;
        name_00._reader._38_1_ = uVar41;
        name_00._reader._39_1_ = in_stack_fffffffffffffb27;
        name_00._reader.nestingLimit = uVar42;
        name_00._reader._44_4_ = in_stack_fffffffffffffb2c;
        expressionString(name_00);
        kj::
        str<char_const(&)[71],kj::String,char_const(&)[9],kj::StringPtr&,char_const(&)[2],kj::StringPtr&,char_const(&)[32]>
                  ((String *)local_458,
                   (kj *)"Constant names must be qualified to avoid confusion.  Please replace \'",
                   (char (*) [71])local_348,(String *)"\' with \'",(char (*) [9])&local_408,
                   (StringPtr *)0x203a52,(char (*) [2])&local_2e8,
                   (StringPtr *)"\', if that\'s what you intended.",
                   (char (*) [32])CONCAT44(uVar30,uVar29));
        lVar15 = CONCAT44(aStack_450.scopeId._4_4_,aStack_450.scopeId._0_4_);
        if (lVar15 == 0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = (char *)CONCAT44(local_458._4_4_,local_458._0_4_);
        }
        uVar19 = 0;
        if (source._reader.dataSize < 0x40) {
          uVar21 = 0;
        }
        else {
          uVar21 = (ulong)*(uint *)((long)source._reader.data + 4);
          if (0x9f < source._reader.dataSize) {
            uVar19 = (ulong)*(uint *)((long)source._reader.data + 0x10);
          }
        }
        (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar21,uVar19,pcVar9,lVar15 + (ulong)(lVar15 == 0));
        lVar15 = CONCAT44(local_458._4_4_,local_458._0_4_);
        if (lVar15 != 0) {
          uVar33 = CONCAT44(aStack_450.scopeId._4_4_,aStack_450.scopeId._0_4_);
          local_458._0_4_ = UNKNOWN;
          local_458._4_4_ = 0;
          aStack_450.scopeId._0_4_ = 0;
          aStack_450.scopeId._4_4_ = 0;
          (*(code *)**(undefined8 **)CONCAT17(uStack_441,uStack_448))
                    ((undefined8 *)CONCAT17(uStack_441,uStack_448),lVar15,1,uVar33,uVar33,0);
        }
        pCVar7 = stack0xfffffffffffffcc0;
        uVar33 = local_348._0_8_;
        if ((SegmentBuilder *)local_348._0_8_ != (SegmentBuilder *)0x0) {
          local_348._0_8_ = (SegmentBuilder *)0x0;
          stack0xfffffffffffffcc0 = (CapTableReader *)0x0;
          (**(code **)*local_338)(local_338,uVar33,1,pCVar7,pCVar7,0);
        }
      }
    }
    __return_storage_ptr__ = local_468;
    (local_468->ptr).isSet = true;
    DynamicValue::Reader::Reader(&(local_468->ptr).field_1.value,(Reader *)&local_3f8);
    DynamicValue::Reader::~Reader((Reader *)&local_3f8);
  }
  else {
LAB_001687a3:
    (__return_storage_ptr__->ptr).isSet = false;
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_268);
LAB_00168e22:
  pBVar20 = local_108.brand.ptr;
  if (local_108.brand.ptr != (BrandScope *)0x0) {
    local_108.brand.ptr = (BrandScope *)0x0;
    (**(local_108.brand.disposer)->_vptr_Disposer)
              (local_108.brand.disposer,
               (pBVar20->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
               (long)&(pBVar20->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<DynamicValue::Reader> NodeTranslator::readConstant(
    Expression::Reader source, bool isBootstrap) {
  // Look up the constant decl.
  BrandedDecl constDecl = nullptr;
  KJ_IF_SOME(decl, compileDeclExpression(source, ImplicitParams::none())) {
    constDecl = decl;
  } else {
    // Lookup will have reported an error.
    return kj::none;
  }